

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * slang::ast::builtins::PlaTask::badRange(ASTContext *context,Expression *arg)

{
  Type *arg_00;
  Scope *pSVar1;
  Diagnostic *diag;
  char *func;
  
  diag = ASTContext::addDiag(context,(DiagCode)0x1c000b,arg->sourceRange);
  arg_00 = (arg->type).ptr;
  if (arg_00 == (Type *)0x0) {
    func = "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
    ;
  }
  else {
    ast::operator<<(diag,arg_00);
    pSVar1 = (context->scope).ptr;
    if (pSVar1 != (Scope *)0x0) {
      return pSVar1->compilation->errorType;
    }
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

static const Type& badRange(const ASTContext& context, const Expression& arg) {
        context.addDiag(diag::PlaRangeInAscendingOrder, arg.sourceRange) << *arg.type;
        return context.getCompilation().getErrorType();
    }